

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xtouch.c
# Opt level: O1

void touch_input_handle_end
               (int id,double timestamp,float x,float y,_Bool primary,ALLEGRO_DISPLAY *disp)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int i;
  ulong uVar3;
  int *piVar4;
  undefined7 in_register_00000031;
  
  piVar4 = touch_ids;
  uVar3 = 0;
  do {
    if (*piVar4 == id) goto LAB_00192df8;
    uVar3 = uVar3 + 1;
    piVar4 = piVar4 + 1;
  } while (uVar3 != 0x10);
  uVar3 = 0xffffffff;
LAB_00192df8:
  if (-1 < (int)uVar3) {
    uVar3 = uVar3 & 0xffffffff;
    _al_event_source_lock(&touch_input.es);
    uVar1 = touch_input_state.touches[uVar3].x;
    uVar2 = touch_input_state.touches[uVar3].y;
    touch_input_state.touches[uVar3].dx = x - (float)uVar1;
    touch_input_state.touches[uVar3].dy = y - (float)uVar2;
    touch_input_state.touches[uVar3].x = x;
    touch_input_state.touches[uVar3].y = y;
    _al_event_source_unlock(&touch_input.es);
    generate_touch_input_event
              (0x33,timestamp,touch_input_state.touches[uVar3].id,touch_input_state.touches[uVar3].x
               ,touch_input_state.touches[uVar3].y,touch_input_state.touches[uVar3].dx,
               touch_input_state.touches[uVar3].dy,*(_Bool *)(uVar3 * 0x20 + 0x1e4c94),
               (ALLEGRO_DISPLAY *)CONCAT71(in_register_00000031,primary));
    _al_event_source_lock(&touch_input.es);
    touch_input_state.touches[uVar3].id = -1;
    touch_ids[uVar3] = -1;
    _al_event_source_unlock(&touch_input.es);
    return;
  }
  return;
}

Assistant:

static void touch_input_handle_end(int id, double timestamp, float x, float y, bool primary, ALLEGRO_DISPLAY *disp)
{
   int index= find_touch_state_index_with_id(id);
   if (index < 0)
       return;

   ALLEGRO_TOUCH_STATE* state = touch_input_state.touches + index;
   (void)primary;

   if (NULL == state)
      return;

   _al_event_source_lock(&touch_input.es);
   state->dx = x - state->x;
   state->dy = y - state->y;
   state->x  = x;
   state->y  = y;
   _al_event_source_unlock(&touch_input.es);

   generate_touch_input_event(ALLEGRO_EVENT_TOUCH_END, timestamp,
      state->id, state->x, state->y, state->dx, state->dy, state->primary,
      disp);

   _al_event_source_lock(&touch_input.es);
   state->id = -1;
   touch_ids[index]= -1;
   _al_event_source_unlock(&touch_input.es);
}